

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleNamerTest.cpp
# Opt level: O0

void __thiscall
GoogleNamerTest_TestSuffixMatcher_Test::~GoogleNamerTest_TestSuffixMatcher_Test
          (GoogleNamerTest_TestSuffixMatcher_Test *this)

{
  void *in_RDI;
  
  ~GoogleNamerTest_TestSuffixMatcher_Test((GoogleNamerTest_TestSuffixMatcher_Test *)0x118208);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(GoogleNamerTest, TestSuffixMatcher)
{
    std::string suffix = "Test";
    std::string fileName = "/a/b/c/testGoogleNamer.cpp";
    std::vector<std::string> testCaseNames = {"GoogleNamerTest",
                                              "GoogleNamer",
                                              "GoogleTest",
                                              "NamerTest",
                                              "NamerTestTest",
                                              "NamerTestTests",
                                              "TestTest",
                                              "Test"};
    Approvals::verifyAll<std::vector<std::string>>(
        "suffix: " + suffix + "\nfilename: " + fileName + "\ntest case names:",
        testCaseNames,
        [&](const std::string& test, std::ostream& os) {
            os << test << ": " << createSuffix(suffix, fileName, test);
        });
}